

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepTrim * __thiscall ON_BrepLoop::Trim(ON_BrepLoop *this,int lti)

{
  ON_Brep *this_00;
  int iVar1;
  int *piVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepTrim *trim;
  int lti_local;
  ON_BrepLoop *this_local;
  
  if (((this->m_brep != (ON_Brep *)0x0) && (-1 < lti)) &&
     (iVar1 = ON_SimpleArray<int>::Count(&this->m_ti), lti < iVar1)) {
    this_00 = this->m_brep;
    piVar2 = ON_SimpleArray<int>::operator[](&this->m_ti,lti);
    pOVar3 = ON_Brep::Trim(this_00,*piVar2);
    return pOVar3;
  }
  return (ON_BrepTrim *)0x0;
}

Assistant:

ON_BrepTrim* ON_BrepLoop::Trim( int lti ) const
{
  ON_BrepTrim* trim = ( m_brep && lti >= 0 && lti < m_ti.Count() )
                    ? m_brep->Trim(m_ti[lti])
                    : 0;
  return trim;
}